

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O2

int bmp_create_bw(char *filename,uint32_t w,uint32_t h,uint8_t *data)

{
  void *__ptr;
  FILE *__s;
  int iVar1;
  uint8_t *data_00;
  ulong __size;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  char cVar6;
  
  __size = (ulong)(w * 3 * h + 0x36);
  data_00 = data;
  __ptr = malloc(__size);
  create_header((char *)(ulong)w,h,(uint32_t)__ptr,data_00);
  iVar1 = 4 - (w & 3);
  if ((w & 3) == 0) {
    iVar1 = 0;
  }
  iVar2 = 0x36;
  while (h = h - 1, -1 < (int)h) {
    pcVar3 = (char *)((long)__ptr + (long)iVar2 + 2);
    iVar2 = iVar2 + iVar1 + w * 3;
    uVar5 = 0;
    while (uVar4 = (uint)uVar5, w != uVar4) {
      cVar6 = ((data[(int)(uVar5 >> 3) + h * (w >> 3)] >> (uVar4 & 7) & 1) != 0) + -1;
      pcVar3[-2] = cVar6;
      pcVar3[-1] = cVar6;
      *pcVar3 = cVar6;
      pcVar3 = pcVar3 + 3;
      uVar5 = (ulong)(uVar4 + 1);
    }
  }
  __s = fopen(filename,"w");
  fwrite(__ptr,1,__size,__s);
  fclose(__s);
  free(__ptr);
  return 0;
}

Assistant:

int bmp_create_bw(char* filename, uint32_t w, uint32_t h, uint8_t* data) {

	FILE *f;
	int index = 0;

	uint32_t filesize = BMP_FILE_HEADER_SIZE + BMP_INFO_HEADER_SIZE + w * h * 3;
	uint8_t* filedata = (uint8_t*)malloc(filesize);

	//Create header
	index += create_header(filename, w, h, filedata);

	//Write data
	for (int i = h - 1; i >= 0; i--) {
		for (int j = 0; j < w; j++) {

			uint8_t byte = data[i * (w / 8) + (j / 8)];
			uint8_t mask = 1 << (j % 8);

			if ((byte & mask) != 0) {
				filedata[index + 0] = 0x00;
				filedata[index + 1] = 0x00;
				filedata[index + 2] = 0x00;
			} else {
				filedata[index + 0] = 0xFF;
				filedata[index + 1] = 0xFF;
				filedata[index + 2] = 0xFF;
			}
			index += 3;
		}

		//Padding should ensure each section is word aligned
		//TODO: this is broken
		index += (w % 4 != 0) ? 4 - (w % 4) : 0;
	}

	//Write file
	f = fopen(filename, "w");
	fwrite(filedata, 1, filesize, f);
	fclose(f);

	free(filedata);

	return 0;
}